

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter> *this,
    BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  char cVar1;
  NLHeader *pNVar2;
  char *pcVar3;
  ExprPrinter *pEVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ReaderBase *this_00;
  NumericExpr *__return_storage_ptr__;
  bool bVar8;
  ReaderBase *local_d8;
  NumericExpr expr;
  NumericExpr local_b0;
  string local_90;
  NumericExpr local_70;
  LogicalExpr local_50;
  
  bVar8 = bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_d8 = (ReaderBase *)bound_reader;
LAB_001208d9:
  this_00 = (ReaderBase *)this->reader_;
  pcVar3 = (((BinaryReaderBase *)&this_00->ptr_)->super_ReaderBase).ptr_;
  this_00->token_ = pcVar3;
  (((BinaryReaderBase *)&this_00->ptr_)->super_ReaderBase).ptr_ = pcVar3 + 1;
  cVar1 = *pcVar3;
  switch(cVar1) {
  case 'C':
    iVar5 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                          num_algebraic_cons);
    pEVar4 = this->handler_;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadNumericExpr_abi_cxx11_
              (&local_b0,
               (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                *)this,true);
    ExprPrinter::OnAlgebraicCon(pEVar4,iVar5,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    goto LAB_001208d9;
  case 'D':
  case 'E':
  case 'H':
  case 'I':
  case 'M':
  case 'N':
  case 'P':
  case 'Q':
  case 'R':
  case 'T':
  case 'U':
switchD_001208fc_caseD_44:
    BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,(CStringRef)0x12ce83);
    goto LAB_001208d9;
  case 'F':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
    uVar7 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (1 < uVar7) {
      BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x12ce2f);
    }
    BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
    BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
    goto LAB_001208d9;
  case 'G':
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ObjHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                *)this);
    goto LAB_001208d9;
  case 'J':
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                *)this);
    goto LAB_001208d9;
  case 'K':
    ReadColumnSizes<false>(this);
    goto LAB_001208d9;
  case 'L':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
    __return_storage_ptr__ = &local_50;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadLogicalExpr_abi_cxx11_
              (__return_storage_ptr__,
               (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                *)this);
    break;
  case 'O':
    iVar5 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
    iVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadNumericExpr_abi_cxx11_
              (&expr,(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                      *)this,true);
    pEVar4 = this->handler_;
    std::__cxx11::string::string((string *)&local_90,(string *)&expr);
    ExprPrinter::OnObj(pEVar4,iVar5,(uint)(iVar6 != 0),&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&expr);
    goto LAB_001208d9;
  case 'S':
    uVar7 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                      ((BinaryReader<mp::internal::EndiannessConverter> *)this_00);
    if (7 < (int)uVar7) {
      BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x12ce45);
    }
    switch(uVar7 & 3) {
    case 0:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,uVar7);
      break;
    case 1:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,uVar7);
      break;
    case 2:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,uVar7);
      break;
    case 3:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ProblemHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,uVar7);
    }
    goto LAB_001208d9;
  case 'V':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
             this->num_vars_and_exprs_);
    iVar5 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (iVar5 != 0) {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::LinearExprHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,iVar5);
    }
    __return_storage_ptr__ = &local_70;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
    ReadNumericExpr_abi_cxx11_
              (__return_storage_ptr__,
               (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                *)this,false);
    break;
  default:
    if (cVar1 == '\0') {
      if (this_00->end_ == pcVar3) {
        if (!bVar8) {
          return;
        }
        BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,(CStringRef)0x12ce6f);
        return;
      }
      goto switchD_001208fc_caseD_44;
    }
    if (cVar1 == 'b') {
      if (bVar8) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this);
        bVar8 = false;
        if ((this->flags_ & 1) != 0) {
          return;
        }
      }
      else {
        if (local_d8 == (ReaderBase *)0x0) {
          BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,(CStringRef)0x12ce59);
          this_00 = (ReaderBase *)this->reader_;
        }
        ReaderBase::operator=(this_00,local_d8);
        local_d8 = (ReaderBase *)0x0;
      }
    }
    else if (cVar1 == 'd') {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
    }
    else if (cVar1 == 'k') {
      ReadColumnSizes<true>(this);
    }
    else if (cVar1 == 'r') {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
    }
    else {
      if (cVar1 != 'x') goto switchD_001208fc_caseD_44;
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
    }
    goto LAB_001208d9;
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  goto LAB_001208d9;
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}